

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_builder.hpp
# Opt level: O3

node_type * __thiscall
pico_tree::internal::
build_kd_tree_impl<pico_tree::internal::space_wrapper<std::vector<std::array<float,784ul>,std::allocator<std::array<float,784ul>>>>,pico_tree::max_leaf_size_t,pico_tree::sliding_midpoint_max_side_t,pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,float>,784ul>>
::create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (build_kd_tree_impl<pico_tree::internal::space_wrapper<std::vector<std::array<float,784ul>,std::allocator<std::array<float,784ul>>>>,pico_tree::max_leaf_size_t,pico_tree::sliding_midpoint_max_side_t,pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,float>,784ul>>
           *this,index_type depth,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,box_type *box)

{
  build_kd_tree_impl<pico_tree::internal::space_wrapper<std::vector<std::array<float,784ul>,std::allocator<std::array<float,784ul>>>>,pico_tree::max_leaf_size_t,pico_tree::sliding_midpoint_max_side_t,pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,float>,784ul>>
  *pbVar1;
  float *pfVar2;
  size_type sVar3;
  float fVar4;
  size_type i;
  undefined8 *puVar5;
  node_type *pnVar6;
  long lVar7;
  size_type sVar8;
  long lVar9;
  long lVar10;
  int depth_00;
  node_type *pnVar11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Jaybro[P]pico_tree_src_pico_tree_pico_tree_internal_kd_tree_builder_hpp:261:11)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Jaybro[P]pico_tree_src_pico_tree_pico_tree_internal_kd_tree_builder_hpp:271:11)>
  __comp_00;
  size_type split_dim;
  scalar_type split_val;
  box_type right;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_18d8;
  size_type local_18d0;
  float local_18c4;
  float local_18c0;
  index_type local_18bc;
  build_kd_tree_impl<pico_tree::internal::space_wrapper<std::vector<std::array<float,784ul>,std::allocator<std::array<float,784ul>>>>,pico_tree::max_leaf_size_t,pico_tree::sliding_midpoint_max_side_t,pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,float>,784ul>>
  *local_18b8;
  undefined1 local_18b0 [16];
  float *local_18a0;
  float afStack_c70 [784];
  
  lVar7 = *(long *)(this + 0x20);
  lVar9 = *(long *)(lVar7 + 0x10);
  local_18bc = depth;
  if (lVar9 == 0x100) {
    puVar5 = (undefined8 *)operator_new(0x2008);
    *puVar5 = *(undefined8 *)(lVar7 + 8);
    *(undefined8 **)(lVar7 + 8) = puVar5;
    puVar5 = puVar5 + 1;
    *(undefined8 **)(lVar7 + 0x18) = puVar5;
    lVar9 = 0;
  }
  else {
    puVar5 = *(undefined8 **)(lVar7 + 0x18);
  }
  pnVar11 = (node_type *)(puVar5 + lVar9 * 4);
  *(long *)(lVar7 + 0x10) = lVar9 + 1;
  uVar12 = (long)end._M_current - (long)begin._M_current >> 2;
  local_18d0 = (size_type)*(int *)(this + 8);
  if ((long)uVar12 <= (long)local_18d0) {
    lVar7 = **(long **)(this + 0x18);
    (pnVar11->data).branch.split_dim = (int)((ulong)((long)begin._M_current - lVar7) >> 2);
    (pnVar11->data).leaf.end_idx = (int)((ulong)((long)end._M_current - lVar7) >> 2);
    (pnVar11->super_kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_float>_>).
    left = (kd_tree_node_euclidean<int,_float> *)0x0;
    (pnVar11->super_kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_float>_>).
    right = (kd_tree_node_euclidean<int,_float> *)0x0;
    lVar7 = -0x310;
    do {
      pfVar2 = (box->storage_).coords_max._M_elems + lVar7;
      pfVar2[0] = 3.4028235e+38;
      pfVar2[1] = 3.4028235e+38;
      pfVar2[2] = 3.4028235e+38;
      pfVar2[3] = 3.4028235e+38;
      pfVar2 = box[1].storage_.coords_min._M_elems + lVar7;
      pfVar2[0] = -3.4028235e+38;
      pfVar2[1] = -3.4028235e+38;
      pfVar2[2] = -3.4028235e+38;
      pfVar2[3] = -3.4028235e+38;
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0);
    if (end._M_current <= begin._M_current) {
      return pnVar11;
    }
    lVar7 = *(long *)**(undefined8 **)this;
    do {
      lVar9 = (long)*begin._M_current * 0xc40 + lVar7;
      lVar10 = 0;
      do {
        fVar13 = *(float *)(lVar9 + lVar10 * 4);
        if (fVar13 < (box->storage_).coords_min._M_elems[lVar10]) {
          (box->storage_).coords_min._M_elems[lVar10] = fVar13;
          fVar13 = *(float *)(lVar9 + lVar10 * 4);
        }
        pfVar2 = (box->storage_).coords_max._M_elems + lVar10;
        if (*pfVar2 <= fVar13 && fVar13 != *pfVar2) {
          (box->storage_).coords_max._M_elems[lVar10] = fVar13;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x310);
      begin._M_current = begin._M_current + 1;
    } while (begin._M_current < end._M_current);
    return pnVar11;
  }
  fVar13 = -3.4028235e+38;
  sVar8 = 0;
  fVar14 = -3.4028235e+38;
  do {
    fVar15 = (box->storage_).coords_max._M_elems[sVar8] - (box->storage_).coords_min._M_elems[sVar8]
    ;
    sVar3 = sVar8;
    fVar4 = fVar15;
    if (fVar15 <= fVar14) {
      fVar15 = fVar14;
      sVar3 = local_18d0;
      fVar4 = fVar13;
    }
    fVar13 = fVar4;
    local_18d0 = sVar3;
    fVar14 = fVar15;
    sVar8 = sVar8 + 1;
  } while (sVar8 != 0x310);
  pbVar1 = this + 0x10;
  local_18b0._8_8_ = &local_18d0;
  local_18c0 = fVar13 * 0.5 + (box->storage_).coords_min._M_elems[local_18d0];
  local_18a0 = &local_18c0;
  local_18b8 = this;
  local_18b0._0_8_ = pbVar1;
  local_18d8 = ::std::operator()(begin._M_current,end._M_current);
  if (local_18d8._M_current == end._M_current) {
    local_18d8._M_current = local_18d8._M_current + -1;
    if (begin._M_current != end._M_current) {
      lVar7 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      __comp._M_comp.split_dim = &local_18d0;
      __comp._M_comp.this =
           (splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>_>
            *)pbVar1;
      ::std::operator()(begin,local_18d8,end,(ulong)(((uint)lVar7 ^ 0x3f) * 2) ^ 0x7e,__comp);
    }
  }
  else {
    if (local_18d8._M_current != begin._M_current) goto LAB_001048da;
    local_18d8._M_current = local_18d8._M_current + 1;
    if (local_18d8._M_current != end._M_current && begin._M_current != end._M_current) {
      lVar7 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      __comp_00._M_comp.split_dim = &local_18d0;
      __comp_00._M_comp.this =
           (splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>_>
            *)pbVar1;
      ::std::operator()(begin,local_18d8,end,(ulong)(((uint)lVar7 ^ 0x3f) * 2) ^ 0x7e,__comp_00);
    }
  }
  local_18c0 = *(float *)((long)*local_18d8._M_current * 0xc40 + **(long **)pbVar1 + local_18d0 * 4)
  ;
LAB_001048da:
  sVar8 = local_18d0;
  local_18c4 = local_18c0;
  memcpy(local_18b0,box,0x1880);
  pbVar1 = local_18b8;
  (box->storage_).coords_max._M_elems[sVar8] = local_18c4;
  *(float *)(local_18b0 + sVar8 * 4) = local_18c4;
  depth_00 = local_18bc + 1;
  pnVar6 = create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                     (local_18b8,depth_00,begin,local_18d8,box);
  (pnVar11->super_kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_float>_>).left
       = pnVar6;
  pnVar6 = create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                     (pbVar1,depth_00,local_18d8,end,(box_type *)local_18b0);
  (pnVar11->super_kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_float>_>).right
       = pnVar6;
  (pnVar11->data).branch.split_dim = (int)local_18d0;
  (pnVar11->data).branch.left_max = (box->storage_).coords_max._M_elems[local_18d0];
  (pnVar11->data).branch.right_min = *(float *)(local_18b0 + local_18d0 * 4);
  lVar7 = 0;
  do {
    if (*(float *)(local_18b0 + lVar7 * 4) < (box->storage_).coords_min._M_elems[lVar7]) {
      (box->storage_).coords_min._M_elems[lVar7] = *(float *)(local_18b0 + lVar7 * 4);
    }
    fVar13 = afStack_c70[lVar7];
    pfVar2 = (box->storage_).coords_max._M_elems + lVar7;
    if (*pfVar2 <= fVar13 && fVar13 != *pfVar2) {
      (box->storage_).coords_max._M_elems[lVar7] = fVar13;
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x310);
  return pnVar11;
}

Assistant:

inline node_type* create_node(
      index_type const depth,
      RandomAccessIterator_ begin,
      RandomAccessIterator_ end,
      box_type& box) const {
    node_type* node = allocator_.allocate();

    if (is_leaf(depth, begin, end)) {
      node->set_leaf(
          static_cast<index_type>(begin - indices_.begin()),
          static_cast<index_type>(end - indices_.begin()));
      // Keep the original box in case it is empty. This can only happen with
      // the midpoint split.
      if constexpr (std::is_same_v<Rule_, midpoint_max_side_t>) {
        if (begin < end) {
          compute_bounding_box(begin, end, box);
        }
      } else {
        compute_bounding_box(begin, end, box);
      }
    } else {
      // split equals end for the left branch and begin for the right branch.
      RandomAccessIterator_ split;
      size_type split_dim;
      scalar_type split_val;
      splitter_(depth, begin, end, box, split, split_dim, split_val);

      box_type right = box;
      // Argument box will function as the left bounding box until we merge
      // left and right again at the end of this code section.
      box.max(split_dim) = split_val;
      right.min(split_dim) = split_val;

      node->left = create_node(depth + 1, begin, split, box);
      node->right = create_node(depth + 1, split, end, right);

      node->set_branch(box, right, split_dim);

      // Merges both child boxes. We can expect any of the min max values to
      // change except for the ones of split_dim.
      box.fit(right);
    }

    return node;
  }